

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_emit_yaml(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  size_t *psVar1;
  code *pcVar2;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location LVar3;
  Location loc_07;
  Location LVar4;
  Location loc_08;
  Location loc_09;
  Location LVar5;
  bool bVar6;
  error_flags eVar7;
  int __fd;
  NodeType NVar8;
  NodeScalar *pNVar9;
  csubstr *pcVar10;
  size_t sVar11;
  size_t sVar12;
  Tree *pTVar13;
  Tree *pTVar14;
  char msg [13];
  anon_class_24_3_fd5fe6d2 write_tag_directives;
  TagDirective *btd;
  char local_f8 [56];
  anon_class_24_3_fd5fe6d2 local_c0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  TagDirective *local_30;
  
  bVar6 = Tree::is_root(this->m_tree,id);
  pTVar14 = this->m_tree;
  pTVar13 = pTVar14;
  if (!bVar6) {
    if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = -0x36;
      local_f8[0x19] = '~';
      local_f8[0x1a] = '\x1f';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = 0;
      local_f8[0x20] = 'e';
      local_f8[0x21] = '\0';
      local_f8[0x22] = 0;
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      loc.super_LineCol.col = 0;
      loc.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc.name.str._0_7_ = 0x1f7eca;
      loc.name.str._7_1_ = 0;
      loc.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc);
      pTVar13 = this->m_tree;
    }
    if ((pTVar14->m_buf[id].m_type.type & (STREAM|MAP)) != NOTYPE) {
      NVar8 = Tree::type(pTVar13,id);
      pTVar13 = this->m_tree;
      if ((NVar8.type & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE) {
        if ((id == 0xffffffffffffffff) || (pTVar13->m_cap <= id)) {
          eVar7 = get_error_flags();
          if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
            pcVar2 = (code *)swi(3);
            (*pcVar2)();
            return;
          }
          local_f8[0] = '\0';
          local_f8[1] = '\0';
          local_f8[2] = '\0';
          local_f8[3] = '\0';
          local_f8[4] = '\0';
          local_f8[5] = '\0';
          local_f8[6] = '\0';
          local_f8[7] = '\0';
          local_f8[8] = -0x7a;
          local_f8[9] = 'K';
          local_f8[10] = '\0';
          local_f8[0xb] = '\0';
          local_f8[0xc] = '\0';
          local_f8[0xd] = '\0';
          local_f8[0xe] = '\0';
          local_f8[0xf] = '\0';
          local_f8[0x10] = '\0';
          local_f8[0x11] = '\0';
          local_f8[0x12] = '\0';
          local_f8[0x13] = '\0';
          local_f8[0x14] = '\0';
          local_f8[0x15] = '\0';
          local_f8[0x16] = '\0';
          local_f8[0x17] = '\0';
          local_f8[0x18] = -0x36;
          local_f8[0x19] = '~';
          local_f8[0x1a] = '\x1f';
          local_f8[0x1b] = '\0';
          local_f8[0x1c] = '\0';
          local_f8[0x1d] = '\0';
          local_f8[0x1e] = '\0';
          local_f8[0x1f] = 0;
          local_f8[0x20] = 'e';
          local_f8[0x21] = '\0';
          local_f8[0x22] = 0;
          local_f8[0x23] = '\0';
          local_f8[0x24] = '\0';
          local_f8[0x25] = '\0';
          local_f8[0x26] = '\0';
          local_f8[0x27] = '\0';
          loc_00.super_LineCol.col = 0;
          loc_00.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
          loc_00.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
          loc_00.name.str._0_7_ = 0x1f7eca;
          loc_00.name.str._7_1_ = 0;
          loc_00.name.len = 0x65;
          error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_00);
        }
        if ((pTVar13->m_buf[id].m_type.type & KEY) == NOTYPE) {
          sVar12 = 0;
          sVar11 = 0;
        }
        else {
          pcVar10 = Tree::key(this->m_tree,id);
          sVar11 = pcVar10->len;
          if (pcVar10->str != (char *)0x0 && sVar11 != 0) {
            std::ostream::write((char *)(this->
                                        super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ).m_stream,(long)pcVar10->str);
            psVar1 = &(this->
                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ).m_pos;
            *psVar1 = *psVar1 + sVar11;
          }
          std::ostream::write((char *)(this->
                                      super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ).m_stream,0x1f8061);
          psVar1 = &(this->
                    super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).m_pos;
          *psVar1 = *psVar1 + 2;
          sVar12 = 1;
          sVar11 = 1;
        }
        _do_visit_block_container(this,id,sVar12,sVar11);
        return;
      }
    }
  }
  Tree::num_tag_directives(pTVar13);
  pTVar14 = this->m_tree;
  local_30 = pTVar13->m_tag_directives;
  sVar11 = Tree::num_tag_directives(pTVar14);
  local_c0.etd = pTVar14->m_tag_directives + sVar11;
  pTVar14 = this->m_tree;
  local_c0.btd = &local_30;
  local_c0.this = this;
  if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = -0x36;
    local_f8[0x19] = '~';
    local_f8[0x1a] = '\x1f';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = 0;
    local_f8[0x20] = 'e';
    local_f8[0x21] = '\0';
    local_f8[0x22] = 0;
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    loc_01.super_LineCol.col = 0;
    loc_01.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_01.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_01.name.str._0_7_ = 0x1f7eca;
    loc_01.name.str._7_1_ = 0;
    loc_01.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_01);
  }
  pTVar13 = this->m_tree;
  if ((~(int)pTVar14->m_buf[id].m_type.type & 0x28U) == 0) {
    sVar11 = Tree::first_child(pTVar13,id);
    if (sVar11 != 0xffffffffffffffff) {
      sVar11 = Tree::first_child(this->m_tree,id);
      _emit_yaml::anon_class_24_3_fd5fe6d2::operator()(&local_c0,sVar11);
    }
    sVar11 = Tree::first_child(this->m_tree,id);
    if (sVar11 == 0xffffffffffffffff) {
      return;
    }
    do {
      NVar8 = Tree::type(this->m_tree,sVar11);
      if (((uint)NVar8.type >> 0xe & 1) == 0) {
        if ((short)NVar8.type < 0) {
          _do_visit_flow_ml(this,sVar11,0,1);
        }
        else {
          _do_visit_block(this,sVar11,0,1);
        }
      }
      else {
        _do_visit_flow_sl(this,sVar11,0);
      }
      sVar12 = Tree::next_sibling(this->m_tree,sVar11);
      if (sVar12 != 0xffffffffffffffff) {
        sVar12 = Tree::next_sibling(this->m_tree,sVar11);
        _emit_yaml::anon_class_24_3_fd5fe6d2::operator()(&local_c0,sVar12);
      }
      sVar11 = Tree::next_sibling(this->m_tree,sVar11);
    } while (sVar11 != 0xffffffffffffffff);
    return;
  }
  if ((id == 0xffffffffffffffff) || (pTVar13->m_cap <= id)) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = -0x36;
    local_f8[0x19] = '~';
    local_f8[0x1a] = '\x1f';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = 0;
    local_f8[0x20] = 'e';
    local_f8[0x21] = '\0';
    local_f8[0x22] = 0;
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    loc_02.super_LineCol.col = 0;
    loc_02.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_02.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_02.name.str._0_7_ = 0x1f7eca;
    loc_02.name.str._7_1_ = 0;
    loc_02.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_02);
  }
  pTVar14 = this->m_tree;
  if ((pTVar13->m_buf[id].m_type.type & (STREAM|MAP)) != NOTYPE) {
    NVar8 = Tree::type(pTVar14,id);
    if (((uint)NVar8.type >> 0xe & 1) != 0) {
      _do_visit_flow_sl(this,id,0);
      return;
    }
    if (-1 < (short)NVar8.type) {
      _do_visit_block(this,id,0,1);
      return;
    }
    _do_visit_flow_ml(this,id,0,1);
    return;
  }
  if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = -0x36;
    local_f8[0x19] = '~';
    local_f8[0x1a] = '\x1f';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = 0;
    local_f8[0x20] = 'e';
    local_f8[0x21] = '\0';
    local_f8[0x22] = 0;
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    loc_03.super_LineCol.col = 0;
    loc_03.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_03.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_03.name.str._0_7_ = 0x1f7eca;
    loc_03.name.str._7_1_ = 0;
    loc_03.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_03);
  }
  pTVar13 = this->m_tree;
  bVar6 = pTVar13->m_cap <= id;
  if ((pTVar14->m_buf[id].m_type.type & DOC) != NOTYPE) {
    if (bVar6 || id == 0xffffffffffffffff) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = -0x36;
      local_f8[0x19] = '~';
      local_f8[0x1a] = '\x1f';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = 0;
      local_f8[0x20] = 'e';
      local_f8[0x21] = '\0';
      local_f8[0x22] = 0;
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      loc_06.super_LineCol.col = 0;
      loc_06.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_06.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_06.name.str._0_7_ = 0x1f7eca;
      loc_06.name.str._7_1_ = 0;
      loc_06.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_06);
    }
    if ((pTVar13->m_buf[id].m_type.type & (STREAM|MAP)) != NOTYPE) {
      builtin_strncpy(local_f8 + 0x10,"m_tree->is_container(id))",0x1a);
      builtin_strncpy(local_f8,"check failed: (!",0x10);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_58 = 0;
      uStack_50 = 0x5883;
      local_48 = 0;
      pcStack_40 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_38 = 0x65;
      LVar3.super_LineCol.col = 0;
      LVar3.super_LineCol.offset = SUB168(ZEXT816(0x5883) << 0x40,0);
      LVar3.super_LineCol.line = SUB168(ZEXT816(0x5883) << 0x40,8);
      LVar3.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar3.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_f8,0x2a,LVar3,(this->m_tree->m_callbacks).m_user_data);
    }
    pTVar14 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = -0x36;
      local_f8[0x19] = '~';
      local_f8[0x1a] = '\x1f';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = 0;
      local_f8[0x20] = 'e';
      local_f8[0x21] = '\0';
      local_f8[0x22] = 0;
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      loc_07.super_LineCol.col = 0;
      loc_07.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_07.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_07.name.str._0_7_ = 0x1f7eca;
      loc_07.name.str._7_1_ = 0;
      loc_07.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_07);
    }
    if ((pTVar14->m_buf[id].m_type.type & KEYVAL) != VAL) {
      builtin_strncpy(local_f8,"check failed: (m_tree->is_val(id))",0x23);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_80 = 0;
      uStack_78 = 0x5884;
      local_70 = 0;
      pcStack_68 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_60 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5884) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x5884) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_f8,0x23,LVar4,(this->m_tree->m_callbacks).m_user_data);
    }
    _write_doc(this,id);
    return;
  }
  if (bVar6 || id == 0xffffffffffffffff) {
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    local_f8[0] = '\0';
    local_f8[1] = '\0';
    local_f8[2] = '\0';
    local_f8[3] = '\0';
    local_f8[4] = '\0';
    local_f8[5] = '\0';
    local_f8[6] = '\0';
    local_f8[7] = '\0';
    local_f8[8] = -0x7a;
    local_f8[9] = 'K';
    local_f8[10] = '\0';
    local_f8[0xb] = '\0';
    local_f8[0xc] = '\0';
    local_f8[0xd] = '\0';
    local_f8[0xe] = '\0';
    local_f8[0xf] = '\0';
    local_f8[0x10] = '\0';
    local_f8[0x11] = '\0';
    local_f8[0x12] = '\0';
    local_f8[0x13] = '\0';
    local_f8[0x14] = '\0';
    local_f8[0x15] = '\0';
    local_f8[0x16] = '\0';
    local_f8[0x17] = '\0';
    local_f8[0x18] = -0x36;
    local_f8[0x19] = '~';
    local_f8[0x1a] = '\x1f';
    local_f8[0x1b] = '\0';
    local_f8[0x1c] = '\0';
    local_f8[0x1d] = '\0';
    local_f8[0x1e] = '\0';
    local_f8[0x1f] = 0;
    local_f8[0x20] = 'e';
    local_f8[0x21] = '\0';
    local_f8[0x22] = 0;
    local_f8[0x23] = '\0';
    local_f8[0x24] = '\0';
    local_f8[0x25] = '\0';
    local_f8[0x26] = '\0';
    local_f8[0x27] = '\0';
    loc_04.super_LineCol.col = 0;
    loc_04.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
    loc_04.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
    loc_04.name.str._0_7_ = 0x1f7eca;
    loc_04.name.str._7_1_ = 0;
    loc_04.name.len = 0x65;
    error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_04);
  }
  pTVar14 = this->m_tree;
  if ((~(int)pTVar13->m_buf[id].m_type.type & 3U) == 0) {
    pNVar9 = Tree::keysc(pTVar14,id);
    pTVar14 = this->m_tree;
    if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = -0x36;
      local_f8[0x19] = '~';
      local_f8[0x1a] = '\x1f';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = 0;
      local_f8[0x20] = 'e';
      local_f8[0x21] = '\0';
      local_f8[0x22] = 0;
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      loc_05.super_LineCol.col = 0;
      loc_05.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_05.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_05.name.str._0_7_ = 0x1f7eca;
      loc_05.name.str._7_1_ = 0;
      loc_05.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_05);
    }
    _write(this,(int)pNVar9,(void *)(ulong)((uint)pTVar14->m_buf[id].m_type.type & 0x2aa2142),0);
    std::ostream::write((char *)(this->
                                super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).m_stream,0x1f8e3f);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 2;
    pNVar9 = Tree::valsc(this->m_tree,id);
    __fd = (int)pNVar9;
    pTVar14 = this->m_tree;
    if ((id != 0xffffffffffffffff) && (id < pTVar14->m_cap)) goto LAB_001921b4;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  else {
    if ((id == 0xffffffffffffffff) || (pTVar14->m_cap <= id)) {
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_f8[0] = '\0';
      local_f8[1] = '\0';
      local_f8[2] = '\0';
      local_f8[3] = '\0';
      local_f8[4] = '\0';
      local_f8[5] = '\0';
      local_f8[6] = '\0';
      local_f8[7] = '\0';
      local_f8[8] = -0x7a;
      local_f8[9] = 'K';
      local_f8[10] = '\0';
      local_f8[0xb] = '\0';
      local_f8[0xc] = '\0';
      local_f8[0xd] = '\0';
      local_f8[0xe] = '\0';
      local_f8[0xf] = '\0';
      local_f8[0x10] = '\0';
      local_f8[0x11] = '\0';
      local_f8[0x12] = '\0';
      local_f8[0x13] = '\0';
      local_f8[0x14] = '\0';
      local_f8[0x15] = '\0';
      local_f8[0x16] = '\0';
      local_f8[0x17] = '\0';
      local_f8[0x18] = -0x36;
      local_f8[0x19] = '~';
      local_f8[0x1a] = '\x1f';
      local_f8[0x1b] = '\0';
      local_f8[0x1c] = '\0';
      local_f8[0x1d] = '\0';
      local_f8[0x1e] = '\0';
      local_f8[0x1f] = 0;
      local_f8[0x20] = 'e';
      local_f8[0x21] = '\0';
      local_f8[0x22] = 0;
      local_f8[0x23] = '\0';
      local_f8[0x24] = '\0';
      local_f8[0x25] = '\0';
      local_f8[0x26] = '\0';
      local_f8[0x27] = '\0';
      loc_08.super_LineCol.col = 0;
      loc_08.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
      loc_08.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
      loc_08.name.str._0_7_ = 0x1f7eca;
      loc_08.name.str._7_1_ = 0;
      loc_08.name.len = 0x65;
      error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_08);
    }
    if ((pTVar14->m_buf[id].m_type.type & KEYVAL) != VAL) {
      NVar8 = Tree::type(this->m_tree,id);
      if (NVar8.type == NOTYPE) {
        return;
      }
      builtin_strncpy(local_f8 + 8,"type",5);
      builtin_strncpy(local_f8,"unknown ",8);
      eVar7 = get_error_flags();
      if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      local_a8 = 0;
      uStack_a0 = 0x589c;
      local_98 = 0;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_88 = 0x65;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x589c) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x589c) << 0x40,8);
      LVar5.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar5.name.len = 0x65;
      (*(this->m_tree->m_callbacks).m_error)
                (local_f8,0xd,LVar5,(this->m_tree->m_callbacks).m_user_data);
      return;
    }
    pNVar9 = Tree::valsc(this->m_tree,id);
    __fd = (int)pNVar9;
    pTVar14 = this->m_tree;
    if ((id != 0xffffffffffffffff) && (id < pTVar14->m_cap)) goto LAB_001921b4;
    eVar7 = get_error_flags();
    if (((eVar7 & 1) != 0) && (bVar6 = is_debugger_attached(), bVar6)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
  }
  local_f8[0] = '\0';
  local_f8[1] = '\0';
  local_f8[2] = '\0';
  local_f8[3] = '\0';
  local_f8[4] = '\0';
  local_f8[5] = '\0';
  local_f8[6] = '\0';
  local_f8[7] = '\0';
  local_f8[8] = -0x7a;
  local_f8[9] = 'K';
  local_f8[10] = '\0';
  local_f8[0xb] = '\0';
  local_f8[0xc] = '\0';
  local_f8[0xd] = '\0';
  local_f8[0xe] = '\0';
  local_f8[0xf] = '\0';
  local_f8[0x10] = '\0';
  local_f8[0x11] = '\0';
  local_f8[0x12] = '\0';
  local_f8[0x13] = '\0';
  local_f8[0x14] = '\0';
  local_f8[0x15] = '\0';
  local_f8[0x16] = '\0';
  local_f8[0x17] = '\0';
  local_f8[0x18] = -0x36;
  local_f8[0x19] = '~';
  local_f8[0x1a] = '\x1f';
  local_f8[0x1b] = '\0';
  local_f8[0x1c] = '\0';
  local_f8[0x1d] = '\0';
  local_f8[0x1e] = '\0';
  local_f8[0x1f] = 0;
  local_f8[0x20] = 'e';
  local_f8[0x21] = '\0';
  local_f8[0x22] = 0;
  local_f8[0x23] = '\0';
  local_f8[0x24] = '\0';
  local_f8[0x25] = '\0';
  local_f8[0x26] = '\0';
  local_f8[0x27] = '\0';
  loc_09.super_LineCol.col = 0;
  loc_09.super_LineCol.offset = SUB168(ZEXT816(0x4b86) << 0x40,0);
  loc_09.super_LineCol.line = SUB168(ZEXT816(0x4b86) << 0x40,8);
  loc_09.name.str._0_7_ = 0x1f7eca;
  loc_09.name.str._7_1_ = 0;
  loc_09.name.len = 0x65;
  error("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,loc_09);
LAB_001921b4:
  _write(this,__fd,(void *)(ulong)((uint)pTVar14->m_buf[id].m_type.type & 0x5541281),0);
  NVar8 = Tree::type(this->m_tree,id);
  if ((NVar8.type & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE) {
    std::ostream::put((char)(this->
                            super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ).m_stream);
    psVar1 = &(this->
              super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_pos;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Emitter<Writer>::_emit_yaml(size_t id)
{
    // save branches in the visitor by doing the initial stream/doc
    // logic here, sparing the need to check stream/val/keyval inside
    // the visitor functions
    auto dispatch = [this](size_t node){
        NodeType ty = m_tree->type(node);
        if(ty.marked_flow_sl())
            _do_visit_flow_sl(node, 0);
        else if(ty.marked_flow_ml())
            _do_visit_flow_ml(node, 0);
        else
        {
            _do_visit_block(node, 0);
        }
    };
    if(!m_tree->is_root(id))
    {
        if(m_tree->is_container(id) && !m_tree->type(id).marked_flow())
        {
            size_t ilevel = 0;
            if(m_tree->has_key(id))
            {
                this->Writer::_do_write(m_tree->key(id));
                this->Writer::_do_write(":\n");
                ++ilevel;
            }
            _do_visit_block_container(id, ilevel, ilevel);
            return;
        }
    }

    auto *btd = m_tree->tag_directives().b;
    auto *etd = m_tree->tag_directives().e;
    auto write_tag_directives = [&btd, etd, this](size_t next_node){
        auto end = btd;
        while(end < etd)
        {
            if(end->next_node_id > next_node)
                break;
            ++end;
        }
        for( ; btd != end; ++btd)
        {
            if(next_node != m_tree->first_child(m_tree->parent(next_node)))
                this->Writer::_do_write("...\n");
            this->Writer::_do_write("%TAG ");
            this->Writer::_do_write(btd->handle);
            this->Writer::_do_write(' ');
            this->Writer::_do_write(btd->prefix);
            this->Writer::_do_write('\n');
        }
    };
    if(m_tree->is_stream(id))
    {
        if(m_tree->first_child(id) != NONE)
            write_tag_directives(m_tree->first_child(id));
        for(size_t child = m_tree->first_child(id); child != NONE; child = m_tree->next_sibling(child))
        {
            dispatch(child);
            if(m_tree->next_sibling(child) != NONE)
                write_tag_directives(m_tree->next_sibling(child));
        }
    }
    else if(m_tree->is_container(id))
    {
        dispatch(id);
    }
    else if(m_tree->is_doc(id))
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->is_container(id)); // checked above
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_val(id)); // so it must be a val
        _write_doc(id);
    }
    else if(m_tree->is_keyval(id))
    {
        _writek(id, 0);
        this->Writer::_do_write(": ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->is_val(id))
    {
        //this->Writer::_do_write("- ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->type(id) == NOTYPE)
    {
        ;
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "unknown type");
    }
}